

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O0

char * getobjname(Proto *p,int lastpc,int reg,char **name)

{
  uint i_00;
  char *pcVar1;
  int k_3;
  int k_2;
  int k_1;
  int k;
  OpCode op;
  Instruction i;
  char *kind;
  char **name_local;
  int reg_local;
  int lastpc_local;
  Proto *p_local;
  
  name_local._0_4_ = reg;
  name_local._4_4_ = lastpc;
  _reg_local = p;
  pcVar1 = basicgetobjname(p,(int *)((long)&name_local + 4),reg,name);
  if (pcVar1 != (char *)0x0) {
    return pcVar1;
  }
  if (name_local._4_4_ == -1) {
LAB_0010e897:
    p_local = (Proto *)0x0;
  }
  else {
    i_00 = _reg_local->code[name_local._4_4_];
    switch(i_00 & 0x7f) {
    case 0xb:
      kname(_reg_local,i_00 >> 0x18,name);
      p_local = (Proto *)isEnv(_reg_local,name_local._4_4_,i_00,1);
      break;
    case 0xc:
      rname(_reg_local,name_local._4_4_,i_00 >> 0x18,name);
      p_local = (Proto *)isEnv(_reg_local,name_local._4_4_,i_00,0);
      break;
    case 0xd:
      *name = "integer index";
      p_local = (Proto *)anon_var_dwarf_6098;
      break;
    case 0xe:
      kname(_reg_local,i_00 >> 0x18,name);
      p_local = (Proto *)isEnv(_reg_local,name_local._4_4_,i_00,0);
      break;
    default:
      goto LAB_0010e897;
    case 0x14:
      kname(_reg_local,i_00 >> 0x18,name);
      p_local = (Proto *)0x144b2d;
    }
  }
  return (char *)p_local;
}

Assistant:

static const char *getobjname (const Proto *p, int lastpc, int reg,
                               const char **name) {
  const char *kind = basicgetobjname(p, &lastpc, reg, name);
  if (kind != NULL)
    return kind;
  else if (lastpc != -1) {  /* could find instruction? */
    Instruction i = p->code[lastpc];
    OpCode op = GET_OPCODE(i);
    switch (op) {
      case OP_GETTABUP: {
        int k = GETARG_C(i);  /* key index */
        kname(p, k, name);
        return isEnv(p, lastpc, i, 1);
      }
      case OP_GETTABLE: {
        int k = GETARG_C(i);  /* key index */
        rname(p, lastpc, k, name);
        return isEnv(p, lastpc, i, 0);
      }
      case OP_GETI: {
        *name = "integer index";
        return "field";
      }
      case OP_GETFIELD: {
        int k = GETARG_C(i);  /* key index */
        kname(p, k, name);
        return isEnv(p, lastpc, i, 0);
      }
      case OP_SELF: {
        int k = GETARG_C(i);  /* key index */
        kname(p, k, name);
        return "method";
      }
      default: break;  /* go through to return NULL */
    }
  }
  return NULL;  /* could not find reasonable name */
}